

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O0

bool __thiscall
uttamarin::App::RunOnLemmas
          (App *this,vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_> *lemma_jobs)

{
  int false_lemmas;
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference pvVar6;
  pointer this_00;
  pointer this_01;
  mapped_type *pmVar7;
  char *__filename;
  element_type *this_02;
  key_type local_130 [4];
  TamarinOutput local_120;
  TamarinOutput output;
  string local_f8;
  undefined1 local_d8 [8];
  string preprocessed_spthy_file;
  undefined1 local_a8 [8];
  value_type lemma_job;
  int i;
  int overall_duration;
  unordered_map<uttamarin::ProverResult,_int,_std::hash<uttamarin::ProverResult>,_std::equal_to<uttamarin::ProverResult>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>_>
  count_of;
  bool success;
  vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_> *lemma_jobs_local;
  App *this_local;
  
  PrintHeader(this);
  count_of._M_h._M_single_bucket._7_1_ = 1;
  std::
  unordered_map<uttamarin::ProverResult,_int,_std::hash<uttamarin::ProverResult>,_std::equal_to<uttamarin::ProverResult>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>_>
  ::unordered_map((unordered_map<uttamarin::ProverResult,_int,_std::hash<uttamarin::ProverResult>,_std::equal_to<uttamarin::ProverResult>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>_>
                   *)&i);
  lemma_job._68_4_ = 0;
  for (lemma_job.heuristic_ = S; uVar4 = (ulong)(int)lemma_job.heuristic_,
      sVar5 = std::vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_>::size
                        (lemma_jobs), uVar4 < sVar5; lemma_job.heuristic_ = lemma_job.heuristic_ + s
      ) {
    pvVar6 = std::vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_>::operator[]
                       (lemma_jobs,(long)(int)lemma_job.heuristic_);
    LemmaJob::LemmaJob((LemmaJob *)local_a8,pvVar6);
    this_00 = std::
              unique_ptr<uttamarin::TheoryPreprocessor,_std::default_delete<uttamarin::TheoryPreprocessor>_>
              ::operator->(&this->theory_preprocessor_);
    LemmaJob::GetSpthyFilePath_abi_cxx11_(&local_f8,(LemmaJob *)local_a8);
    LemmaJob::GetLemmaName_abi_cxx11_((string *)&output,(LemmaJob *)local_a8);
    TheoryPreprocessor::PreprocessAndReturnPathToResultingFile
              ((string *)local_d8,this_00,&local_f8,(string *)&output);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&local_f8);
    LemmaJob::SetSpthyFilePath((LemmaJob *)local_a8,(string *)local_d8);
    this_01 = std::
              unique_ptr<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_>
              ::operator->(&this->lemma_processor_);
    local_120 = LemmaProcessor::ProcessLemma(this_01,(LemmaJob *)local_a8);
    iVar3 = lemma_job.heuristic_ + s;
    sVar5 = std::vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_>::size(lemma_jobs)
    ;
    PrintLemmaResults(this,(LemmaJob *)local_a8,&local_120,iVar3,(int)sVar5);
    lemma_job._68_4_ = lemma_job._68_4_ + local_120.duration;
    pmVar7 = std::
             unordered_map<uttamarin::ProverResult,_int,_std::hash<uttamarin::ProverResult>,_std::equal_to<uttamarin::ProverResult>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>_>
             ::operator[]((unordered_map<uttamarin::ProverResult,_int,_std::hash<uttamarin::ProverResult>,_std::equal_to<uttamarin::ProverResult>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>_>
                           *)&i,&local_120.result);
    *pmVar7 = *pmVar7 + 1;
    __filename = (char *)std::__cxx11::string::c_str();
    remove(__filename);
    if (local_120.result == True) {
LAB_001430a7:
      local_130[3] = 0;
    }
    else {
      count_of._M_h._M_single_bucket._7_1_ = 0;
      this_02 = std::
                __shared_ptr_access<uttamarin::UtTamarinConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<uttamarin::UtTamarinConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->config_);
      bVar2 = UtTamarinConfig::IsAbortAfterFailure(this_02);
      if (!bVar2) goto LAB_001430a7;
      local_130[3] = 2;
    }
    std::__cxx11::string::~string((string *)local_d8);
    LemmaJob::~LemmaJob((LemmaJob *)local_a8);
    if (local_130[3] != 0) break;
  }
  local_130[2] = 0;
  pmVar7 = std::
           unordered_map<uttamarin::ProverResult,_int,_std::hash<uttamarin::ProverResult>,_std::equal_to<uttamarin::ProverResult>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>_>
           ::operator[]((unordered_map<uttamarin::ProverResult,_int,_std::hash<uttamarin::ProverResult>,_std::equal_to<uttamarin::ProverResult>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>_>
                         *)&i,local_130 + 2);
  iVar3 = *pmVar7;
  local_130[1] = 1;
  pmVar7 = std::
           unordered_map<uttamarin::ProverResult,_int,_std::hash<uttamarin::ProverResult>,_std::equal_to<uttamarin::ProverResult>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>_>
           ::operator[]((unordered_map<uttamarin::ProverResult,_int,_std::hash<uttamarin::ProverResult>,_std::equal_to<uttamarin::ProverResult>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>_>
                         *)&i,local_130 + 1);
  false_lemmas = *pmVar7;
  local_130[0] = Unknown;
  pmVar7 = std::
           unordered_map<uttamarin::ProverResult,_int,_std::hash<uttamarin::ProverResult>,_std::equal_to<uttamarin::ProverResult>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>_>
           ::operator[]((unordered_map<uttamarin::ProverResult,_int,_std::hash<uttamarin::ProverResult>,_std::equal_to<uttamarin::ProverResult>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>_>
                         *)&i,local_130);
  PrintFooter(this,iVar3,false_lemmas,*pmVar7,lemma_job._68_4_);
  bVar1 = count_of._M_h._M_single_bucket._7_1_;
  local_130[3] = 1;
  std::
  unordered_map<uttamarin::ProverResult,_int,_std::hash<uttamarin::ProverResult>,_std::equal_to<uttamarin::ProverResult>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>_>
  ::~unordered_map((unordered_map<uttamarin::ProverResult,_int,_std::hash<uttamarin::ProverResult>,_std::equal_to<uttamarin::ProverResult>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>_>
                    *)&i);
  return (bool)(bVar1 & 1);
}

Assistant:

bool App::RunOnLemmas(const vector<LemmaJob>& lemma_jobs) {
  PrintHeader();

  bool success = true;
  unordered_map<ProverResult, int> count_of;
  int overall_duration = 0;

  for(int i=0;i < lemma_jobs.size();i++) {
    auto lemma_job = lemma_jobs[i];
    auto preprocessed_spthy_file =
            theory_preprocessor_->PreprocessAndReturnPathToResultingFile(
                    lemma_job.GetSpthyFilePath(), lemma_job.GetLemmaName());

    lemma_job.SetSpthyFilePath(preprocessed_spthy_file);
    auto output = lemma_processor_->ProcessLemma(lemma_job);

    PrintLemmaResults(lemma_job, output, i+1, lemma_jobs.size());

    overall_duration += output.duration;
    count_of[output.result]++;
    std::remove(preprocessed_spthy_file.c_str());
    if(output.result != ProverResult::True) {
      success = false;
      if(config_->IsAbortAfterFailure()) break;
    }
  }

  PrintFooter(count_of[ProverResult::True], count_of[ProverResult::False],
              count_of[ProverResult::Unknown], overall_duration);

  return success;
}